

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_c8515::RemoveInteractionsFromBPM_basic_Test::TestBody
          (RemoveInteractionsFromBPM_basic_Test *this)

{
  void *pvVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar2;
  bool bVar3;
  double *it;
  double *pdVar4;
  int iVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *key;
  long lVar6;
  pointer key_00;
  __normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  _Var7;
  char *pcVar8;
  char *expected_predicate_value;
  pointer puVar9;
  pointer *__ptr;
  double dVar10;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  initializer_list<unsigned_int> __l_03;
  initializer_list<unsigned_int> __l_04;
  initializer_list<unsigned_int> __l_05;
  initializer_list<unsigned_int> __l_06;
  initializer_list<unsigned_int> __l_07;
  initializer_list<unsigned_int> __l_08;
  initializer_list<unsigned_int> __l_09;
  initializer_list<unsigned_int> __l_10;
  initializer_list<unsigned_int> __l_11;
  initializer_list<unsigned_int> __l_12;
  initializer_list<unsigned_int> __l_13;
  initializer_list<unsigned_int> __l_14;
  initializer_list<unsigned_int> __l_15;
  initializer_list<unsigned_int> __l_16;
  initializer_list<unsigned_int> __l_17;
  initializer_list<unsigned_int> __l_18;
  initializer_list<unsigned_int> __l_19;
  initializer_list<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> __l_20;
  initializer_list<unsigned_int> __l_21;
  initializer_list<unsigned_int> __l_22;
  initializer_list<unsigned_int> __l_23;
  initializer_list<unsigned_int> __l_24;
  initializer_list<unsigned_int> __l_25;
  initializer_list<unsigned_int> __l_26;
  AssertionResult gtest_ar;
  PolynomialKeyList<uint32_t> removed_key_list;
  BinaryPolynomialModel<unsigned_int,_double> bpm;
  Polynomial<uint32_t,_double> polynomial;
  undefined1 local_590 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_588;
  pointer local_580;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_578;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_560;
  undefined1 local_548 [16];
  undefined1 local_538 [32];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_518;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined1 local_4e5;
  char local_4e4;
  undefined1 local_4e3;
  allocator_type local_4e2;
  allocator_type local_4e1;
  allocator_type local_4e0;
  allocator_type local_4df;
  allocator_type local_4de;
  allocator_type local_4dd;
  allocator_type local_4dc;
  allocator_type local_4db;
  allocator_type local_4da;
  allocator_type local_4d9;
  allocator_type local_4d8;
  allocator_type local_4d7;
  allocator_type local_4d6;
  allocator_type local_4d5;
  allocator_type local_4d4;
  allocator_type local_4d3;
  allocator_type local_4d2;
  allocator_type local_4d1;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_4d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_4b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_4a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_488;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_470;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_458;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_440;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_428;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_410;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_398;
  uint local_37c [5];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_368;
  uint local_350 [2];
  undefined1 *local_348;
  uint local_340 [2];
  undefined8 local_338;
  uint local_330 [2];
  long local_328;
  undefined1 *local_320;
  undefined1 local_318 [56];
  undefined1 local_2e0 [32];
  undefined1 *local_2c0;
  undefined1 local_2b8 [24];
  size_type local_2a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_298;
  size_t local_280;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_278;
  pointer local_260;
  undefined1 local_258 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_248;
  pointer local_240;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_238;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined8 local_1e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1d8;
  undefined8 local_1c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1b8;
  undefined8 local_1a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_198;
  undefined8 local_180;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_178;
  undefined8 local_160;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_158;
  undefined8 local_140;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_138;
  undefined8 local_120;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_118;
  undefined8 local_100;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_f8;
  undefined8 local_e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d8;
  undefined8 local_c0;
  undefined1 local_b8 [4];
  uint local_b4 [6];
  undefined1 *local_9c;
  undefined4 local_94;
  undefined1 *local_90;
  undefined4 local_88;
  undefined1 *local_84;
  undefined4 local_7c;
  _Hashtable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_78;
  undefined1 *local_40;
  undefined1 *puStack_38;
  
  local_37c[4] = 1;
  __l._M_len = 1;
  __l._M_array = local_37c + 4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_548,__l,&local_4d1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_318,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_548);
  local_318._24_8_ = 0x3ff0000000000000;
  local_37c[3] = 2;
  __l_00._M_len = 1;
  __l_00._M_array = local_37c + 3;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_4d0,__l_00,&local_4d2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_318 + 0x20),
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_4d0);
  local_2e0._0_8_ = &DAT_4000000000000000;
  local_37c[2] = 3;
  __l_01._M_len = 1;
  __l_01._M_array = local_37c + 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_590,__l_01,&local_4d3);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_2e0 + 8),
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_590);
  local_2c0 = &DAT_4008000000000000;
  local_37c[1] = 4;
  __l_02._M_len = 1;
  __l_02._M_array = local_37c + 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_578,__l_02,&local_4d4);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2b8,&local_578);
  local_2a0 = 0x4010000000000000;
  local_320 = &DAT_200000001;
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)&local_320;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_560,__l_03,&local_4d5);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_298,&local_560);
  local_280 = 0x4028000000000000;
  local_328 = 0x300000001;
  __l_04._M_len = 2;
  __l_04._M_array = (iterator)&local_328;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_4a0,__l_04,&local_4d6);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_278,&local_4a0);
  local_260 = (pointer)&DAT_402a000000000000;
  local_330[0] = 1;
  local_330[1] = 4;
  __l_05._M_len = 2;
  __l_05._M_array = local_330;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_4b8,__l_05,&local_4d7);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_258,&local_4b8);
  local_240 = (pointer)0x402c000000000000;
  local_338 = 0x300000002;
  __l_06._M_len = 2;
  __l_06._M_array = (iterator)&local_338;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_470,__l_06,&local_4d8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_238,&local_470);
  local_220._0_8_ = (__buckets_ptr)0x4037000000000000;
  local_340[0] = 2;
  local_340[1] = 4;
  __l_07._M_len = 2;
  __l_07._M_array = local_340;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_488,__l_07,&local_4d9);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_220 + 8),&local_488);
  local_200._0_8_ = 0x4038000000000000;
  local_348 = &DAT_400000003;
  __l_08._M_len = 2;
  __l_08._M_array = (iterator)&local_348;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_398,__l_08,&local_4da);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_200 + 8),&local_398);
  local_1e0 = 0x4041000000000000;
  local_84 = &DAT_c0000000b;
  local_7c = 0xe;
  __l_09._M_len = 3;
  __l_09._M_array = (iterator)&local_84;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_3b0,__l_09,&local_4db);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_1d8,&local_3b0);
  local_1c0 = 0xbff0000000000000;
  local_37c[0] = 7;
  __l_10._M_len = 1;
  __l_10._M_array = local_37c;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_3c8,__l_10,&local_4dc);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_1b8,&local_3c8);
  local_1a0 = 0xc000000000000000;
  local_350[0] = 2;
  local_350[1] = 0xb;
  __l_11._M_len = 2;
  __l_11._M_array = local_350;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_3e0,__l_11,&local_4dd);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_198,&local_3e0);
  local_180 = 0xc022000000000000;
  local_368.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_368.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_368.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_178,&local_368);
  local_160 = 0xc008000000000000;
  local_90 = &DAT_200000001;
  local_88 = 3;
  __l_12._M_len = 3;
  __l_12._M_array = (iterator)&local_90;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_3f8,__l_12,&local_4de);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_158,&local_3f8);
  local_140 = 0x405ec00000000000;
  local_9c = &DAT_200000001;
  local_94 = 4;
  __l_13._M_len = 3;
  __l_13._M_array = (iterator)&local_9c;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_410,__l_13,&local_4df);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_138,&local_410);
  local_120 = 0x405f000000000000;
  local_b4[3] = 1;
  local_b4[4] = 3;
  local_b4[5] = 4;
  __l_14._M_len = 3;
  __l_14._M_array = local_b4 + 3;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_428,__l_14,&local_4e0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_118,&local_428);
  local_100 = 0x4060c00000000000;
  local_b4[0] = 2;
  local_b4[1] = 3;
  local_b4[2] = 4;
  __l_15._M_len = 3;
  __l_15._M_array = local_b4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_440,__l_15,&local_4e1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_f8,&local_440);
  local_e0 = 0x406d400000000000;
  local_40 = &DAT_200000001;
  puStack_38 = &DAT_400000003;
  __l_16._M_len = 4;
  __l_16._M_array = (iterator)&local_40;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_458,__l_16,&local_4e2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_d8,&local_458);
  local_c0 = 0x4093480000000000;
  expected_predicate_value = &local_4e4;
  std::
  _Hashtable<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,double>,std::allocator<std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,double>>,std::__detail::_Select1st,std::equal_to<std::vector<unsigned_int,std::allocator<unsigned_int>>>,cimod::vector_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,double>const*>
            ((_Hashtable<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,double>,std::allocator<std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,double>>,std::__detail::_Select1st,std::equal_to<std::vector<unsigned_int,std::allocator<unsigned_int>>>,cimod::vector_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_78,local_318,local_b8,0,&local_4e3,expected_predicate_value,&local_4e5);
  lVar6 = 0x260;
  do {
    pvVar1 = *(void **)((long)&local_338 + lVar6);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)&local_328 + lVar6) - (long)pvVar1);
    }
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != 0);
  if (local_458.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_458.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_458.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_458.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_440.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_440.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_440.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_440.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_428.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_428.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_428.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_428.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_410.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_410.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_410.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_410.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_368.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_368.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_368.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_368.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_398.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_398.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_398.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_398.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_488.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_488.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_488.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_488.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_470.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_470.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_470.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_470.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_4b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_4b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_4b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_4a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_4a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_4a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_560.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_560.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_560.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_560.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_578.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_578.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_578.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_578.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_590 != (undefined1  [8])0x0) {
    operator_delete((void *)local_590,(long)local_580 - (long)local_590);
  }
  if (local_4d0.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    operator_delete(local_4d0.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_4d0.
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_4d0.
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_548._0_8_,local_538._0_8_ - local_548._0_8_);
  }
  cimod::BinaryPolynomialModel<unsigned_int,_double>::BinaryPolynomialModel
            ((BinaryPolynomialModel<unsigned_int,_double> *)local_318,
             (Polynomial<unsigned_int,_double> *)&local_78,SPIN);
  local_590 = (undefined1  [8])0xe0000000b;
  local_588 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CONCAT44(local_588._4_4_,0xc);
  __l_17._M_len = 3;
  __l_17._M_array = (iterator)local_590;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_548,__l_17,
             (allocator_type *)&local_4a0);
  local_560.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_560.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,7);
  __l_18._M_len = 1;
  __l_18._M_array = (iterator)&local_560;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_538 + 8),__l_18,
             (allocator_type *)&local_4b8);
  local_578.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x20000000b;
  __l_19._M_len = 2;
  __l_19._M_array = (iterator)&local_578;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_518,__l_19,(allocator_type *)&local_470);
  local_500 = 0;
  uStack_4f8 = 0;
  local_4f0 = 0;
  __l_20._M_len = 4;
  __l_20._M_array = (iterator)local_548;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&local_4d0,__l_20,(allocator_type *)&local_488);
  lVar6 = 0x60;
  do {
    pvVar1 = *(void **)((long)&local_560.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar6);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)(local_548 + lVar6 + -8) - (long)pvVar1);
    }
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != 0);
  if (local_4d0.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_4d0.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    key_00 = local_4d0.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      cimod::BinaryPolynomialModel<unsigned_int,_double>::RemoveInteraction
                ((BinaryPolynomialModel<unsigned_int,_double> *)local_318,key_00);
      key_00 = key_00 + 1;
    } while (key_00 != local_4d0.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_548._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  local_548._8_8_ = (pointer)0x0;
  local_538._0_8_ = (pointer)0x0;
  dVar10 = cimod::BinaryPolynomialModel<unsigned_int,_double>::GetPolynomial
                     ((BinaryPolynomialModel<unsigned_int,_double> *)local_318,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_548);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_590,"bpm.GetPolynomial({} )","0.0",dVar10,0.0);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_548._0_8_,local_538._0_8_ - local_548._0_8_);
  }
  if (local_590[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_548);
    if (local_588 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_588->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_578,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x3c6,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_578,(Message *)local_548);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_548._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_548._0_8_ + 8))();
    }
  }
  if (local_588 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_588,local_588);
  }
  local_578.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_578.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,7);
  __l_21._M_len = 1;
  __l_21._M_array = (iterator)&local_578;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_548,__l_21,
             (allocator_type *)&local_560);
  dVar10 = cimod::BinaryPolynomialModel<unsigned_int,_double>::GetPolynomial
                     ((BinaryPolynomialModel<unsigned_int,_double> *)local_318,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_548);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_590,"bpm.GetPolynomial({7} )","0.0",dVar10,0.0);
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_548._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_548._0_8_,local_538._0_8_ - local_548._0_8_);
  }
  if (local_590[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_548);
    if (local_588 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_588->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_578,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x3c7,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_578,(Message *)local_548);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_548._0_8_ + 8))();
    }
  }
  if (local_588 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_588,local_588);
  }
  local_578.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xb00000002;
  __l_22._M_len = 2;
  __l_22._M_array = (iterator)&local_578;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_548,__l_22,
             (allocator_type *)&local_560);
  dVar10 = cimod::BinaryPolynomialModel<unsigned_int,_double>::GetPolynomial
                     ((BinaryPolynomialModel<unsigned_int,_double> *)local_318,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_548);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_590,"bpm.GetPolynomial({2, 11} )","0.0",dVar10,0.0);
  if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )local_548._0_8_ !=
      (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    operator_delete((void *)local_548._0_8_,local_538._0_8_ - local_548._0_8_);
  }
  if (local_590[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_548);
    if (local_588 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_588->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_578,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x3c8,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_578,(Message *)local_548);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_548._0_8_ + 8))();
    }
  }
  if (local_588 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_588,local_588);
  }
  local_578.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&DAT_c0000000b;
  local_578.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0xe;
  __l_23._M_len = 3;
  __l_23._M_array = (iterator)&local_578;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_548,__l_23,
             (allocator_type *)&local_560);
  dVar10 = cimod::BinaryPolynomialModel<unsigned_int,_double>::GetPolynomial
                     ((BinaryPolynomialModel<unsigned_int,_double> *)local_318,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_548);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_590,"bpm.GetPolynomial({11, 12, 14})","0.0",dVar10,0.0);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_548._0_8_,local_538._0_8_ - local_548._0_8_);
  }
  if (local_590[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_548);
    if (local_588 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_588->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_578,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x3c9,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_578,(Message *)local_548);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_548._0_8_ + 8))();
    }
  }
  if (local_588 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_588,local_588);
  }
  pvVar2 = local_248;
  local_548._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  local_548._8_8_ = (pointer)0x0;
  local_538._0_8_ = (pointer)0x0;
  puVar9 = (pointer)0x0;
  local_578.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_548;
  if ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_258._8_8_ != local_248) {
    _Var7._M_current = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_258._8_8_;
    do {
      bVar3 = __gnu_cxx::__ops::
              _Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>::
              operator()((_Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>
                          *)&local_578,_Var7);
      puVar9 = (pointer)((long)puVar9 + (ulong)bVar3);
      _Var7._M_current = _Var7._M_current + 1;
    } while (_Var7._M_current != pvVar2);
  }
  local_578.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)local_578.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  local_560.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = puVar9;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_590,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{} )"
             ,"0",(long *)&local_560,(int *)&local_578);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_548._0_8_,local_538._0_8_ - local_548._0_8_);
  }
  if (local_590[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_548);
    if (local_588 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_588->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_578,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x3cb,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_578,(Message *)local_548);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_548._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_548._0_8_ + 8))();
    }
  }
  if (local_588 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_588,local_588);
  }
  pvVar2 = local_248;
  _Var7._M_current = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_258._8_8_;
  local_4a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_4a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,7);
  __l_24._M_len = 1;
  __l_24._M_array = (iterator)&local_4a0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_548,__l_24,
             (allocator_type *)&local_4b8);
  puVar9 = (pointer)0x0;
  local_578.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_548;
  if (_Var7._M_current != pvVar2) {
    do {
      bVar3 = __gnu_cxx::__ops::
              _Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>::
              operator()((_Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>
                          *)&local_578,_Var7);
      puVar9 = (pointer)((long)puVar9 + (ulong)bVar3);
      _Var7._M_current = _Var7._M_current + 1;
    } while (_Var7._M_current != pvVar2);
  }
  local_578.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)local_578.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  local_560.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = puVar9;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_590,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{7} )"
             ,"0",(long *)&local_560,(int *)&local_578);
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_548._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_548._0_8_,local_538._0_8_ - local_548._0_8_);
  }
  if (local_590[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_548);
    if (local_588 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_588->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_578,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x3cc,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_578,(Message *)local_548);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_548._0_8_ + 8))();
    }
  }
  if (local_588 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_588,local_588);
  }
  pvVar2 = local_248;
  _Var7._M_current = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_258._8_8_;
  local_4a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xb00000002;
  __l_25._M_len = 2;
  __l_25._M_array = (iterator)&local_4a0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_548,__l_25,
             (allocator_type *)&local_4b8);
  puVar9 = (pointer)0x0;
  local_578.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_548;
  if (_Var7._M_current != pvVar2) {
    do {
      bVar3 = __gnu_cxx::__ops::
              _Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>::
              operator()((_Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>
                          *)&local_578,_Var7);
      puVar9 = (pointer)((long)puVar9 + (ulong)bVar3);
      _Var7._M_current = _Var7._M_current + 1;
    } while (_Var7._M_current != pvVar2);
  }
  local_578.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)local_578.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  local_560.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = puVar9;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_590,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{2, 11} )"
             ,"0",(long *)&local_560,(int *)&local_578);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_548._0_8_,local_538._0_8_ - local_548._0_8_);
  }
  if (local_590[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_548);
    if (local_588 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_588->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_578,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x3cd,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_578,(Message *)local_548);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_548._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_548._0_8_ + 8))();
    }
  }
  if (local_588 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_588,local_588);
  }
  local_578.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&DAT_c0000000b;
  local_578.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0xe;
  __l_26._M_len = 3;
  __l_26._M_array = (iterator)&local_578;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_548,__l_26,
             (allocator_type *)&local_4b8);
  puVar9 = (pointer)0x0;
  local_560.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_548;
  if ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_258._8_8_ != local_248) {
    _Var7._M_current = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_258._8_8_;
    do {
      bVar3 = __gnu_cxx::__ops::
              _Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>::
              operator()((_Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>
                          *)&local_560,_Var7);
      puVar9 = (pointer)((long)puVar9 + (ulong)bVar3);
      _Var7._M_current = _Var7._M_current + 1;
    } while (_Var7._M_current != local_248);
  }
  local_560.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)local_560.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  local_4a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = puVar9;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_590,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{11, 12, 14})"
             ,"0",(long *)&local_4a0,(int *)&local_560);
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_548._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_548._0_8_,local_538._0_8_ - local_548._0_8_);
  }
  if (local_590[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_548);
    if (local_588 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_588->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_578,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x3ce,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_578,(Message *)local_548);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_548._0_8_ + 8))();
    }
  }
  if (local_588 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_588,local_588);
  }
  if (local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar3 = true;
  }
  else {
    iVar5 = 0;
    pdVar4 = (double *)
             local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      iVar5 = iVar5 + (uint)(ABS(*pdVar4 + 3.0) < 1e-15);
      pdVar4 = pdVar4 + 1;
    } while (pdVar4 != (double *)
                       local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    bVar3 = iVar5 == 0;
  }
  local_590[0] = (internal)bVar3;
  local_588 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar3 == false) {
    testing::Message::Message((Message *)&local_578);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_548,(internal *)local_590,
               (AssertionResult *)"EXPECT_CONTAIN(-3.0, bpm.GetValueList())","true","false",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_560,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x3d0,(char *)local_548._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_560,(Message *)&local_578);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_560);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_538) {
      operator_delete((void *)local_548._0_8_,local_538._0_8_ + 1);
    }
    if (local_578.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_578.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  if (local_588 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_588,local_588);
  }
  if (local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar3 = true;
  }
  else {
    iVar5 = 0;
    pdVar4 = (double *)
             local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      iVar5 = iVar5 + (uint)(ABS(*pdVar4 + 2.0) < 1e-15);
      pdVar4 = pdVar4 + 1;
    } while (pdVar4 != (double *)
                       local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    bVar3 = iVar5 == 0;
  }
  local_590[0] = (internal)bVar3;
  local_588 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar3 == false) {
    testing::Message::Message((Message *)&local_578);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_548,(internal *)local_590,
               (AssertionResult *)"EXPECT_CONTAIN(-2.0, bpm.GetValueList())","true","false",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_560,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x3d1,(char *)local_548._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_560,(Message *)&local_578);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_560);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_538) {
      operator_delete((void *)local_548._0_8_,local_538._0_8_ + 1);
    }
    if (local_578.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_578.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  if (local_588 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_588,local_588);
  }
  if (local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar3 = true;
  }
  else {
    iVar5 = 0;
    pdVar4 = (double *)
             local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      iVar5 = iVar5 + (uint)(ABS(*pdVar4 + 9.0) < 1e-15);
      pdVar4 = pdVar4 + 1;
    } while (pdVar4 != (double *)
                       local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    bVar3 = iVar5 == 0;
  }
  local_590[0] = (internal)bVar3;
  local_588 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar3 == false) {
    testing::Message::Message((Message *)&local_578);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_548,(internal *)local_590,
               (AssertionResult *)"EXPECT_CONTAIN(-9.0, bpm.GetValueList())","true","false",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_560,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x3d2,(char *)local_548._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_560,(Message *)&local_578);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_560);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_538) {
      operator_delete((void *)local_548._0_8_,local_538._0_8_ + 1);
    }
    if (local_578.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_578.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  if (local_588 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_588,local_588);
  }
  if (local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar3 = true;
  }
  else {
    iVar5 = 0;
    pdVar4 = (double *)
             local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      iVar5 = iVar5 + (uint)(ABS(*pdVar4 + 1.0) < 1e-15);
      pdVar4 = pdVar4 + 1;
    } while (pdVar4 != (double *)
                       local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    bVar3 = iVar5 == 0;
  }
  local_590[0] = (internal)bVar3;
  local_588 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar3 == false) {
    testing::Message::Message((Message *)&local_578);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_548,(internal *)local_590,
               (AssertionResult *)"EXPECT_CONTAIN(-1.0, bpm.GetValueList())","true","false",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_560,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x3d3,(char *)local_548._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_560,(Message *)&local_578);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_560);
    if ((undefined1 *)local_548._0_8_ != local_538) {
      operator_delete((void *)local_548._0_8_,local_538._0_8_ + 1);
    }
    if (local_578.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_578.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  if (local_588 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_588,local_588);
  }
  StateTestBPMUINT((BinaryPolynomialModel<unsigned_int,_double> *)local_318);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_4d0);
  std::
  _Hashtable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_220);
  if ((double *)
      local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (double *)0x0) {
    operator_delete(local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)(local_258 + 8));
  if (local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    operator_delete(local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish,
                    (long)local_260 -
                    (long)local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_long>,_std::allocator<std::pair<const_unsigned_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_long>,_std::allocator<std::pair<const_unsigned_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)(local_2b8 + 0x10));
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_2e0);
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_318);
  std::
  _Hashtable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_78);
  return;
}

Assistant:

TEST(RemoveInteractionsFromBPM, basic) {
   
   Polynomial<uint32_t, double> polynomial {
      //linear biases
      {{1}, 1.0}, {{2}, 2.0}, {{3}, 3.0}, {{4}, 4.0},
      //quadratic biases
      {{1, 2}, 12.0}, {{1, 3}, 13.0}, {{1, 4}, 14.0},
      {{2, 3}, 23.0}, {{2, 4}, 24.0},
      {{3, 4}, 34.0},
      //To be removed
      {{11, 12, 14}, -1.0}, {{7}, -2.0}, {{2, 11}, -9.0}, {{}, -3},
      //polynomial biases
      {{1, 2, 3}, 123.0}, {{1, 2, 4}, 124.0}, {{1, 3, 4}, 134.0},
      {{2, 3, 4}, 234.0},
      {{1, 2, 3, 4}, 1234.0}
   };
   
   BinaryPolynomialModel<uint32_t, double> bpm(polynomial, Vartype::SPIN);
   
   PolynomialKeyList<uint32_t> removed_key_list = {
      {11, 14, 12}, {7}, {11, 2}, {}
   };
   
   bpm.RemoveInteractionsFrom(removed_key_list);
      
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({}          ), 0.0);
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({7}         ), 0.0);
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({2, 11}     ), 0.0);
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({11, 12, 14}), 0.0);
   
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{}          ), 0);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{7}         ), 0);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{2, 11}     ), 0);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{11, 12, 14}), 0);
   
   EXPECT_FALSE(EXPECT_CONTAIN(-3.0, bpm.GetValueList()));
   EXPECT_FALSE(EXPECT_CONTAIN(-2.0, bpm.GetValueList()));
   EXPECT_FALSE(EXPECT_CONTAIN(-9.0, bpm.GetValueList()));
   EXPECT_FALSE(EXPECT_CONTAIN(-1.0, bpm.GetValueList()));
   
   StateTestBPMUINT(bpm);
   
}